

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_cfg.cpp
# Opt level: O1

void mpp_dec_cfg_set_default(MppDecCfgSet *cfg)

{
  (cfg->base).type = MPP_CTX_BUTT;
  (cfg->base).coding = MPP_VIDEO_CodingUnused;
  (cfg->base).hw_type = -1;
  (cfg->base).fast_parse = 1;
  (cfg->base).enable_fast_play = 1;
  return;
}

Assistant:

void mpp_dec_cfg_set_default(MppDecCfgSet *cfg)
{
    cfg->base.type = MPP_CTX_BUTT;
    cfg->base.coding = MPP_VIDEO_CodingUnused;
    cfg->base.hw_type = -1;
    cfg->base.fast_parse = 1;
#ifdef ENABLE_FASTPLAY_ONCE
    cfg->base.enable_fast_play = MPP_ENABLE_FAST_PLAY_ONCE;
#else
    cfg->base.enable_fast_play = MPP_ENABLE_FAST_PLAY;
#endif
}